

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

char * ssh2_fingerprint(ssh_key *data,FingerprintType fptype)

{
  ptrlen blob;
  strbuf *buf_o;
  char *pcVar1;
  
  buf_o = strbuf_new();
  (*data->vt->public_blob)(data,buf_o->binarysink_);
  blob.ptr = buf_o->u;
  blob.len = buf_o->len;
  pcVar1 = ssh2_fingerprint_blob(blob,fptype);
  strbuf_free(buf_o);
  return pcVar1;
}

Assistant:

char *ssh2_fingerprint(ssh_key *data, FingerprintType fptype)
{
    strbuf *blob = strbuf_new();
    ssh_key_public_blob(data, BinarySink_UPCAST(blob));
    char *ret = ssh2_fingerprint_blob(ptrlen_from_strbuf(blob), fptype);
    strbuf_free(blob);
    return ret;
}